

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImageLoaderBMP.cpp
# Opt level: O2

void __thiscall
irr::video::CImageLoaderBMP::decompress8BitRLE
          (CImageLoaderBMP *this,u8 **bmpData,s32 size,s32 width,s32 height,s32 pitch)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  uint uVar4;
  int iVar5;
  byte *pbVar6;
  byte *pbVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  uintptr_t endI_1;
  byte *pbVar12;
  uintptr_t baseI_1;
  byte *pbVar13;
  uintptr_t endI;
  byte *pbVar14;
  bool bVar15;
  
  pbVar13 = *bmpData;
  pbVar12 = pbVar13 + size;
  iVar5 = width + pitch;
  pbVar3 = (byte *)operator_new__((long)(height * iVar5));
  pbVar14 = pbVar3 + height * iVar5;
  iVar2 = 0;
  pbVar6 = pbVar3;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          if ((pbVar12 <= pbVar13) || (pbVar14 <= pbVar6)) goto LAB_00217b77;
          uVar10 = (ulong)*pbVar13;
          pbVar7 = pbVar13 + 1;
          bVar15 = (ulong)((long)pbVar12 - (long)pbVar7) < 2 || pbVar12 < pbVar7;
          if (*pbVar13 == 0) break;
          if ((bVar15) || ((ulong)((long)pbVar14 - (long)pbVar6) <= uVar10)) goto LAB_00217b77;
          bVar1 = pbVar13[1];
          pbVar13 = pbVar13 + 2;
          while (iVar8 = (int)uVar10, uVar10 = (ulong)(iVar8 - 1), iVar8 != 0) {
            *pbVar6 = bVar1;
            pbVar6 = pbVar6 + 1;
          }
        }
        if (bVar15) goto LAB_00217b77;
        if (*pbVar7 != 0) break;
        iVar2 = iVar2 + 1;
        pbVar6 = pbVar3 + iVar2 * iVar5;
        pbVar13 = pbVar13 + 2;
      }
      uVar9 = (uint)*pbVar7;
      if (uVar9 != 2) break;
      if ((pbVar12 < pbVar13 + 2) || ((ulong)((long)pbVar12 - (long)(pbVar13 + 2)) < 3))
      goto LAB_00217b77;
      pbVar6 = pbVar6 + (ulong)pbVar13[3] * (long)iVar5 + (ulong)pbVar13[2];
      pbVar13 = pbVar13 + 4;
    }
    if (uVar9 == 1) break;
    pbVar13 = pbVar13 + 2;
    if (((pbVar12 < pbVar13) || ((ulong)((long)pbVar12 - (long)pbVar13) <= (ulong)uVar9)) ||
       ((ulong)((long)pbVar14 - (long)pbVar6) <= (ulong)uVar9)) break;
    for (lVar11 = 0; uVar9 != (uint)lVar11; lVar11 = lVar11 + 1) {
      pbVar6[lVar11] = pbVar13[lVar11];
      pbVar7 = pbVar7 + 1;
    }
    if ((pbVar12 < pbVar13 + lVar11) ||
       ((ulong)(((long)pbVar12 - (long)pbVar13) - lVar11) <= (ulong)(uVar9 & 1))) break;
    pbVar6 = pbVar6 + lVar11;
    uVar4 = 0;
    do {
      pbVar7 = pbVar7 + 1;
      bVar15 = uVar4 < (uVar9 & 1);
      uVar4 = 1;
      pbVar13 = pbVar7;
    } while (bVar15);
  }
LAB_00217b77:
  if (*bmpData != (u8 *)0x0) {
    operator_delete__(*bmpData);
  }
  *bmpData = pbVar3;
  return;
}

Assistant:

void CImageLoaderBMP::decompress8BitRLE(u8 *&bmpData, s32 size, s32 width, s32 height, s32 pitch) const
{
	u8 *p = bmpData;
	const u8 *pEnd = bmpData + size;
	u8 *newBmp = new u8[(width + pitch) * height];
	u8 *d = newBmp;
	const u8 *destEnd = newBmp + (width + pitch) * height;
	s32 line = 0;

	while (p < pEnd && d < destEnd) {
		if (*p == 0) {
			++p;
			CHECKP(1);

			switch (*p) {
			case 0: // end of line
				++p;
				++line;
				d = newBmp + (line * (width + pitch));
				break;
			case 1: // end of bmp
				goto exit;
			case 2:
				++p;
				CHECKP(2);
				d += (u8)*p;
				++p; // delta
				d += ((u8)*p) * (width + pitch);
				++p;
				break;
			default: {
				// absolute mode
				s32 count = (u8)*p;
				++p;
				s32 readAdditional = ((2 - (count % 2)) % 2);

				CHECKP(count);
				CHECKD(count);
				for (s32 i = 0; i < count; ++i) {
					*d = *p;
					++p;
					++d;
				}

				CHECKP(readAdditional);
				for (s32 i = 0; i < readAdditional; ++i)
					++p;
			}
			}
		} else {
			s32 count = (u8)*p;
			++p;
			CHECKP(1);
			u8 color = *p;
			++p;
			CHECKD(count);
			for (s32 i = 0; i < count; ++i) {
				*d = color;
				++d;
			}
		}
	}

exit:
	delete[] bmpData;
	bmpData = newBmp;
}